

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.h
# Opt level: O3

clock_t __thiscall EnvelopeGenerator::clock(EnvelopeGenerator *this)

{
  uint uVar1;
  ulong in_RAX;
  ulong uVar2;
  reg16 rVar3;
  ulong uVar4;
  State SVar5;
  int in_ESI;
  uint uVar6;
  byte bVar7;
  reg8 rVar8;
  
  if (in_ESI != 0) {
    rVar3 = this->rate_counter;
    uVar2 = (ulong)this->rate_period;
    uVar6 = this->rate_period - rVar3;
    uVar1 = uVar6 + 0x7fff;
    if (0 < (int)uVar6) {
      uVar1 = uVar6;
    }
    if ((int)uVar1 <= in_ESI) {
      bVar7 = this->hold_zero;
      SVar5 = this->state;
      uVar4 = (ulong)uVar1;
      do {
        this->rate_counter = 0;
        if (((SVar5 == ATTACK) ||
            (rVar8 = this->exponential_counter + 1, this->exponential_counter = rVar8,
            rVar8 == this->exponential_counter_period)) &&
           (this->exponential_counter = 0, (bVar7 & 1) == 0)) {
          rVar8 = this->envelope_counter;
          if (SVar5 == RELEASE) {
            rVar8 = rVar8 - 1 & 0xff;
LAB_00169fb0:
            this->envelope_counter = rVar8;
LAB_00169fb4:
            if ((int)rVar8 < 0x1a) {
              if (rVar8 == 0) {
                this->exponential_counter_period = 1;
                this->hold_zero = true;
                bVar7 = 1;
              }
              else if (rVar8 == 6) {
                this->exponential_counter_period = 0x1e;
              }
              else if (rVar8 == 0xe) {
                this->exponential_counter_period = 0x10;
              }
            }
            else if ((int)rVar8 < 0x5d) {
              if (rVar8 == 0x1a) {
                this->exponential_counter_period = 8;
              }
              else if (rVar8 == 0x36) {
                this->exponential_counter_period = 4;
              }
            }
            else if (rVar8 == 0x5d) {
              this->exponential_counter_period = 2;
            }
            else if (rVar8 == 0xff) goto LAB_0016a009;
          }
          else {
            if (SVar5 == DECAY_SUSTAIN) {
              if (rVar8 != sustain_level[this->sustain]) {
                rVar8 = rVar8 - 1;
                goto LAB_00169fb0;
              }
              goto LAB_00169fb4;
            }
            if (SVar5 != ATTACK) goto LAB_00169fb4;
            rVar8 = rVar8 + 1 & 0xff;
            this->envelope_counter = rVar8;
            if (rVar8 != 0xff) goto LAB_00169fb4;
            this->state = DECAY_SUSTAIN;
            uVar2 = (ulong)rate_counter_period[this->decay];
            this->rate_period = rate_counter_period[this->decay];
            SVar5 = DECAY_SUSTAIN;
LAB_0016a009:
            this->exponential_counter_period = 1;
          }
        }
        in_ESI = in_ESI - (int)uVar4;
        if (in_ESI == 0) {
          return uVar2;
        }
        uVar4 = uVar2;
      } while ((int)uVar2 <= in_ESI);
      rVar3 = 0;
    }
    uVar1 = rVar3 + in_ESI;
    in_RAX = (ulong)uVar1;
    uVar6 = rVar3 + in_ESI + 1 & 0x7fff;
    if (-1 < (short)uVar1) {
      uVar6 = uVar1;
    }
    this->rate_counter = uVar6;
  }
  return in_RAX;
}

Assistant:

RESID_INLINE
void EnvelopeGenerator::clock(cycle_count delta_t)
{
  // Check for ADSR delay bug.
  // If the rate counter comparison value is set below the current value of the
  // rate counter, the counter will continue counting up until it wraps around
  // to zero at 2^15 = 0x8000, and then count rate_period - 1 before the
  // envelope can finally be stepped.
  // This has been verified by sampling ENV3.
  //

  // NB! This requires two's complement integer.
  int rate_step = rate_period - rate_counter;
  if (rate_step <= 0) {
    rate_step += 0x7fff;
  }

  while (delta_t) {
    if (delta_t < rate_step) {
      rate_counter += delta_t;
      if (rate_counter & 0x8000) {
	++rate_counter &= 0x7fff;
      }
      return;
    }

    rate_counter = 0;
    delta_t -= rate_step;

    // The first envelope step in the attack state also resets the exponential
    // counter. This has been verified by sampling ENV3.
    //
    if (state == ATTACK	|| ++exponential_counter == exponential_counter_period)
    {
      exponential_counter = 0;

      // Check whether the envelope counter is frozen at zero.
      if (hold_zero) {
	rate_step = rate_period;
	continue;
      }

      switch (state) {
      case ATTACK:
	// The envelope counter can flip from 0xff to 0x00 by changing state to
	// release, then to attack. The envelope counter is then frozen at
	// zero; to unlock this situation the state must be changed to release,
	// then to attack. This has been verified by sampling ENV3.
	//
	++envelope_counter &= 0xff;
	if (envelope_counter == 0xff) {
	  state = DECAY_SUSTAIN;
	  rate_period = rate_counter_period[decay];
	}
	break;
      case DECAY_SUSTAIN:
	if (envelope_counter != sustain_level[sustain]) {
	  --envelope_counter;
	}
	break;
      case RELEASE:
	// The envelope counter can flip from 0x00 to 0xff by changing state to
	// attack, then to release. The envelope counter will then continue
	// counting down in the release state.
	// This has been verified by sampling ENV3.
	// NB! The operation below requires two's complement integer.
	//
	--envelope_counter &= 0xff;
	break;
      }

      // Check for change of exponential counter period.
      switch (envelope_counter) {
      case 0xff:
	exponential_counter_period = 1;
	break;
      case 0x5d:
	exponential_counter_period = 2;
	break;
      case 0x36:
	exponential_counter_period = 4;
	break;
      case 0x1a:
	exponential_counter_period = 8;
	break;
      case 0x0e:
	exponential_counter_period = 16;
	break;
      case 0x06:
	exponential_counter_period = 30;
	break;
      case 0x00:
	exponential_counter_period = 1;

	// When the envelope counter is changed to zero, it is frozen at zero.
	// This has been verified by sampling ENV3.
	hold_zero = true;
	break;
      }
    }

    rate_step = rate_period;
  }
}